

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comp_mask_pred_test.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_180f112::AV1HighbdCompAvgPredTest_CheckOutput_Test::TestBody
          (AV1HighbdCompAvgPredTest_CheckOutput_Test *this)

{
  anon_enum_8 aVar1;
  byte bVar2;
  byte bVar3;
  _func_void_uchar_ptr_uchar_ptr_int_int_uchar_ptr_int *p_Var4;
  ParamType *pPVar5;
  uint16_t *puVar6;
  uint16_t *puVar7;
  int iVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  SEARCH_METHODS *message;
  ulong uVar12;
  ulong uVar13;
  AssertHelper local_50;
  Message local_48;
  AssertionResult gtest_ar;
  
  pPVar5 = testing::
           WithParamInterface<std::tuple<void_(*)(unsigned_char_*,_const_unsigned_char_*,_int,_int,_const_unsigned_char_*,_int),_BLOCK_SIZE,_int>_>
           ::GetParam();
  p_Var4 = (pPVar5->
           super__Tuple_impl<0UL,_void_(*)(unsigned_char_*,_const_unsigned_char_*,_int,_int,_const_unsigned_char_*,_int),_BLOCK_SIZE,_int>
           ).
           super__Head_base<0UL,_void_(*)(unsigned_char_*,_const_unsigned_char_*,_int,_int,_const_unsigned_char_*,_int),_false>
           ._M_head_impl;
  pPVar5 = testing::
           WithParamInterface<std::tuple<void_(*)(unsigned_char_*,_const_unsigned_char_*,_int,_int,_const_unsigned_char_*,_int),_BLOCK_SIZE,_int>_>
           ::GetParam();
  aVar1 = (pPVar5->
          super__Tuple_impl<0UL,_void_(*)(unsigned_char_*,_const_unsigned_char_*,_int,_int,_const_unsigned_char_*,_int),_BLOCK_SIZE,_int>
          ).super__Tuple_impl<1UL,_BLOCK_SIZE,_int>.super__Head_base<1UL,_BLOCK_SIZE,_false>.
          _M_head_impl;
  bVar2 = ::block_size_wide[aVar1];
  bVar3 = ::block_size_high[aVar1];
  uVar9 = (ulong)bVar3;
  aom_highbd_comp_avg_pred_c
            ((uint8_t *)((ulong)(this->super_AV1HighbdCompAvgPredTest).comp_pred1_ >> 1),
             (uint8_t *)((ulong)(this->super_AV1HighbdCompAvgPredTest).pred_ >> 1),(uint)bVar2,
             (uint)bVar3,(uint8_t *)((ulong)(this->super_AV1HighbdCompAvgPredTest).ref_ >> 1),0x80);
  (*p_Var4)((uchar *)((ulong)(this->super_AV1HighbdCompAvgPredTest).comp_pred2_ >> 1),
            (uchar *)((ulong)(this->super_AV1HighbdCompAvgPredTest).pred_ >> 1),(int)bVar2,
            (int)bVar3,(uchar *)((ulong)(this->super_AV1HighbdCompAvgPredTest).ref_ >> 1),0x80);
  puVar6 = (this->super_AV1HighbdCompAvgPredTest).comp_pred1_;
  puVar7 = (this->super_AV1HighbdCompAvgPredTest).comp_pred2_;
  uVar11 = (ulong)((uint)bVar2 + (uint)bVar2);
  iVar8 = 0;
  lVar10 = 0;
  uVar12 = 0;
  do {
    uVar13 = uVar9;
    if (uVar12 == uVar9) {
LAB_00670871:
      local_48.ss_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._0_1_ = uVar9 <= uVar13;
      local_50.data_._0_1_ = 1;
      testing::internal::CmpHelperEQ<bool,bool>
                ((internal *)&gtest_ar,"CheckResult(w, h)","true",(bool *)&local_48,
                 (bool *)&local_50);
      if (gtest_ar.success_ == false) {
        testing::Message::Message(&local_48);
        if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )gtest_ar.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl ==
            (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )0x0) {
          message = "";
        }
        else {
          message = *(SEARCH_METHODS **)
                     gtest_ar.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_50,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/comp_mask_pred_test.cc"
                   ,0x328,(char *)message);
        testing::internal::AssertHelper::operator=(&local_50,&local_48);
        testing::internal::AssertHelper::~AssertHelper(&local_50);
        if ((long *)CONCAT71(local_48.ss_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl._1_7_,
                             local_48.ss_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl._0_1_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT71(local_48.ss_._M_t.
                                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         .
                                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                         ._M_head_impl._1_7_,
                                         local_48.ss_._M_t.
                                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         .
                                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                         ._M_head_impl._0_1_) + 8))();
        }
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar.message_);
      return;
    }
    for (uVar13 = 0; bVar2 != uVar13; uVar13 = uVar13 + 1) {
      if (puVar6[uVar13] != puVar7[uVar13]) {
        printf("%dx%d mismatch @%d(%d,%d) ",(ulong)bVar2,uVar9,(ulong)(uint)((int)uVar13 - iVar8),
               uVar13 & 0xffffffff,uVar12 & 0xffffffff);
        printf("%d != %d ",
               (ulong)*(ushort *)
                       ((long)(this->super_AV1HighbdCompAvgPredTest).comp_pred1_ +
                       uVar13 * 2 + lVar10),
               (ulong)*(ushort *)
                       ((long)(this->super_AV1HighbdCompAvgPredTest).comp_pred2_ +
                       uVar13 * 2 + lVar10));
        uVar13 = uVar12;
        goto LAB_00670871;
      }
    }
    uVar12 = uVar12 + 1;
    lVar10 = lVar10 + uVar11;
    iVar8 = iVar8 - (uint)bVar2;
    puVar7 = (uint16_t *)((long)puVar7 + uVar11);
    puVar6 = (uint16_t *)((long)puVar6 + uVar11);
  } while( true );
}

Assistant:

TEST_P(AV1HighbdCompAvgPredTest, CheckOutput) {
  RunCheckOutput(GET_PARAM(0), GET_PARAM(1));
}